

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemStringify(Mem *pMem,int enc)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  char *z2;
  char *pcVar5;
  int iVar6;
  
  uVar2 = pMem->flags;
  iVar3 = sqlite3VdbeMemGrow(pMem,0x20,0);
  iVar6 = 7;
  if (iVar3 == 0) {
    if ((uVar2 & 4) == 0) {
      sqlite3_snprintf(0x20,pMem->z,"%!.15g",pMem->r);
    }
    else {
      sqlite3_snprintf(0x20,pMem->z,"%lld",(pMem->u).i);
    }
    pcVar5 = pMem->z;
    iVar6 = 0;
    uVar4 = 0;
    if (pcVar5 != (char *)0x0) {
      uVar4 = 0xffffffff;
      do {
        uVar4 = uVar4 + 1;
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar1 != '\0');
      uVar4 = uVar4 & 0x3fffffff;
    }
    pMem->n = uVar4;
    pMem->enc = '\x01';
    pMem->flags = pMem->flags | 0x202;
    sqlite3VdbeChangeEncoding(pMem,enc);
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, int enc){
  int rc = SQLITE_OK;
  int fg = pMem->flags;
  const int nByte = 32;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(fg&MEM_Zero) );
  assert( !(fg&(MEM_Str|MEM_Blob)) );
  assert( fg&(MEM_Int|MEM_Real) );
  assert( (pMem->flags&MEM_RowSet)==0 );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemGrow(pMem, nByte, 0) ){
    return SQLITE_NOMEM;
  }

  /* For a Real or Integer, use sqlite3_mprintf() to produce the UTF-8
  ** string representation of the value. Then, if the required encoding
  ** is UTF-16le or UTF-16be do a translation.
  ** 
  ** FIX ME: It would be better if sqlite3_snprintf() could do UTF-16.
  */
  if( fg & MEM_Int ){
    sqlite3_snprintf(nByte, pMem->z, "%lld", pMem->u.i);
  }else{
    assert( fg & MEM_Real );
    sqlite3_snprintf(nByte, pMem->z, "%!.15g", pMem->r);
  }
  pMem->n = sqlite3Strlen30(pMem->z);
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  sqlite3VdbeChangeEncoding(pMem, enc);
  return rc;
}